

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O0

RK_S32 mpp_av1_decoder_model_info(AV1Context *ctx,BitReadCtx_t *gb,AV1RawDecoderModelInfo *current)

{
  RK_U8 local_3c [4];
  RK_U8 local_38 [4];
  RK_U32 value_3;
  RK_U32 value_2;
  RK_U32 value_1;
  RK_U32 value;
  RK_S32 err;
  AV1RawDecoderModelInfo *current_local;
  BitReadCtx_t *gb_local;
  AV1Context *ctx_local;
  
  _value = current;
  current_local = (AV1RawDecoderModelInfo *)gb;
  gb_local = &ctx->gb;
  value_1 = mpp_av1_read_unsigned(gb,5,"buffer_delay_length_minus_1",&value_2,0,0x1f);
  ctx_local._4_4_ = value_1;
  if (-1 < (int)value_1) {
    _value->buffer_delay_length_minus_1 = (RK_U8)value_2;
    value_1 = mpp_av1_read_unsigned
                        ((BitReadCtx_t *)current_local,0x20,"num_units_in_decoding_tick",&value_3,0,
                         0xffffffff);
    ctx_local._4_4_ = value_1;
    if (-1 < (int)value_1) {
      _value->num_units_in_decoding_tick = value_3;
      value_1 = mpp_av1_read_unsigned
                          ((BitReadCtx_t *)current_local,5,"buffer_removal_time_length_minus_1",
                           (RK_U32 *)local_38,0,0x1f);
      ctx_local._4_4_ = value_1;
      if (-1 < (int)value_1) {
        _value->buffer_removal_time_length_minus_1 = local_38[0];
        ctx_local._4_4_ =
             mpp_av1_read_unsigned
                       ((BitReadCtx_t *)current_local,5,"frame_presentation_time_length_minus_1",
                        (RK_U32 *)local_3c,0,0x1f);
        if (-1 < (int)ctx_local._4_4_) {
          _value->frame_presentation_time_length_minus_1 = local_3c[0];
          ctx_local._4_4_ = 0;
        }
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static RK_S32 mpp_av1_decoder_model_info(AV1Context *ctx, BitReadCtx_t *gb,
                                         AV1RawDecoderModelInfo *current)
{
    RK_S32 err;
    (void)ctx;
    fb(5, buffer_delay_length_minus_1);
    fb(32, num_units_in_decoding_tick);
    fb(5,  buffer_removal_time_length_minus_1);
    fb(5,  frame_presentation_time_length_minus_1);

    return 0;
}